

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase(DescriptorPool *this,string *name)

{
  Tables *pTVar1;
  bool bVar2;
  int iVar3;
  FileDescriptor *pFVar4;
  const_iterator cVar5;
  FileDescriptorProto file_proto;
  pointer local_f0;
  FileDescriptorProto local_e8;
  
  if ((this->fallback_database_ == (DescriptorDatabase *)0x0) ||
     (bVar2 = IsSubSymbolOfBuiltType(this,name), bVar2)) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto(&local_e8);
  iVar3 = (*this->fallback_database_->_vptr_DescriptorDatabase[3])
                    (this->fallback_database_,name,&local_e8);
  if ((char)iVar3 != '\0') {
    pTVar1 = (this->tables_).ptr_;
    if (pTVar1 == (Tables *)0x0) {
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                    ,0x1e2,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                   );
    }
    local_f0 = ((local_e8.name_)->_M_dataplus)._M_p;
    cVar5 = std::tr1::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                    *)&pTVar1->files_by_name_,&local_f0);
    if ((cVar5.
         super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
         ._M_cur_node ==
         (pTVar1->files_by_name_).
         super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
         .
         super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
         .
         super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
         ._M_buckets
         [(pTVar1->files_by_name_).
          super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
          .
          super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count]) ||
       (((cVar5.
          super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
         ._M_cur_node)->_M_v).second == (FileDescriptor *)0x0)) {
      pFVar4 = BuildFileFromDatabase(this,&local_e8);
      bVar2 = pFVar4 != (FileDescriptor *)0x0;
      goto LAB_001cab6d;
    }
  }
  bVar2 = false;
LAB_001cab6d:
  FileDescriptorProto::~FileDescriptorProto(&local_e8);
  return bVar2;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(const string& name) const {
  if (fallback_database_ == NULL) return false;

  // We skip looking in the fallback database if the name is a sub-symbol of
  // any descriptor that already exists in the descriptor pool (except for
  // package descriptors).  This is valid because all symbols except for
  // packages are defined in a single file, so if the symbol exists then we
  // should already have its definition.
  //
  // The other reason to do this is to support "overriding" type definitions
  // by merging two databases that define the same type.  (Yes, people do
  // this.)  The main difficulty with making this work is that
  // FindFileContainingSymbol() is allowed to return both false positives
  // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and false
  // negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).  When two
  // such databases are merged, looking up a non-existent sub-symbol of a type
  // that already exists in the descriptor pool can result in an attempt to
  // load multiple definitions of the same type.  The check below avoids this.
  if (IsSubSymbolOfBuiltType(name)) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingSymbol(name, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != NULL) {
    // We've already loaded this file, and it apparently doesn't contain the
    // symbol we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == NULL) {
    return false;
  }

  return true;
}